

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ConfigRuleSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == CellConfigRule) || (kind == DefaultConfigRule)) || (kind == InstanceConfigRule)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ConfigRuleSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CellConfigRule:
        case SyntaxKind::DefaultConfigRule:
        case SyntaxKind::InstanceConfigRule:
            return true;
        default:
            return false;
    }
}